

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void sensors_analytics::Sdk::Identify(string *distinct_id,bool is_login_id)

{
  size_t __n;
  long lVar1;
  int iVar2;
  
  lVar1 = instance_;
  if (instance_ != 0) {
    if (((bool)*(char *)(instance_ + 0x28) != is_login_id) ||
       (__n = distinct_id->_M_string_length, __n != *(size_t *)(instance_ + 0x10))) {
LAB_00113a0b:
      std::__cxx11::string::_M_assign((string *)(lVar1 + 8));
      *(bool *)(instance_ + 0x28) = is_login_id;
      Notify();
      return;
    }
    if (__n != 0) {
      iVar2 = bcmp((distinct_id->_M_dataplus)._M_p,*(void **)(instance_ + 8),__n);
      if (iVar2 != 0) goto LAB_00113a0b;
    }
  }
  return;
}

Assistant:

void Sdk::Identify(const string &distinct_id, bool is_login_id) {
  if (instance_) {
      // 当登录状态和 distinct_id 都未发生变化时，不更新 distinct_id 和 is_login_id
      if (is_login_id == instance_->is_login_id_ && distinct_id == instance_->distinct_id_) {
          return;
      }

    instance_->distinct_id_ = distinct_id;
    instance_->is_login_id_ = is_login_id;
    instance_->Notify();
  }
}